

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceWholeDebugValue
          (ScalarReplacementPass *this,Instruction *dbg_value,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var1;
  int iVar2;
  pointer ppIVar3;
  pointer ppIVar4;
  ConstantManager *this_00;
  Instruction *pIVar5;
  DefUseManager *this_01;
  pointer *__ptr;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_b8;
  int local_ac;
  uint32_t local_a8;
  uint32_t local_a4;
  pointer local_a0;
  Instruction *local_98;
  BasicBlock *local_90;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  local_90 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,dbg_value);
  local_a0 = (replacements->
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_ac = 0;
  ppIVar3 = (replacements->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_98 = dbg_value;
  do {
    ppIVar4 = ppIVar3;
    if (ppIVar4 == local_a0) break;
    pIVar5 = *ppIVar4;
    local_b8._M_head_impl = Instruction::Clone(local_98,(this->super_MemPass).super_Pass.context_);
    local_a8 = Pass::TakeNextId((Pass *)this);
    if (local_a8 != 0) {
      Instruction::SetResultId(local_b8._M_head_impl,local_a8);
      _Var1._M_head_impl = local_b8._M_head_impl;
      local_58._vptr_SmallVector._0_4_ = Instruction::result_id(pIVar5);
      init_list._M_len = 1;
      init_list._M_array = (iterator)&local_58;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)&local_88,init_list);
      Instruction::SetOperand(_Var1._M_head_impl,5,(OperandData *)&local_88);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)&local_88);
      _Var1._M_head_impl = local_b8._M_head_impl;
      this_00 = IRContext::get_constant_mgr((this->super_MemPass).super_Pass.context_);
      iVar2 = local_ac;
      local_a4 = analysis::ConstantManager::GetSIntConstId(this_00,local_ac);
      init_list_00._M_len = 1;
      init_list_00._M_array = &local_a4;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_00);
      local_88.type = SPV_OPERAND_TYPE_ID;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&(_Var1._M_head_impl)->operands_,&local_88);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      pIVar5 = Instruction::InsertBefore
                         (local_98,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                    *)&local_b8);
      this_01 = Pass::get_def_use_mgr((Pass *)this);
      analysis::DefUseManager::AnalyzeInstDefUse(this_01,pIVar5);
      IRContext::set_instr_block((this->super_MemPass).super_Pass.context_,pIVar5,local_90);
      local_ac = iVar2 + 1;
    }
    if (local_b8._M_head_impl != (Instruction *)0x0) {
      (*((local_b8._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
    ppIVar3 = ppIVar4 + 1;
  } while (local_a8 != 0);
  return ppIVar4 == local_a0;
}

Assistant:

bool ScalarReplacementPass::ReplaceWholeDebugValue(
    Instruction* dbg_value, const std::vector<Instruction*>& replacements) {
  int32_t idx = 0;
  BasicBlock* block = context()->get_instr_block(dbg_value);
  for (auto var : replacements) {
    // Clone the DebugValue.
    std::unique_ptr<Instruction> new_dbg_value(dbg_value->Clone(context()));
    uint32_t new_id = TakeNextId();
    if (new_id == 0) return false;
    new_dbg_value->SetResultId(new_id);
    // Update 'Value' operand to the |replacements|.
    new_dbg_value->SetOperand(kDebugValueOperandValueIndex, {var->result_id()});
    // Append 'Indexes' operand.
    new_dbg_value->AddOperand(
        {SPV_OPERAND_TYPE_ID,
         {context()->get_constant_mgr()->GetSIntConstId(idx)}});
    // Insert the new DebugValue to the basic block.
    auto* added_instr = dbg_value->InsertBefore(std::move(new_dbg_value));
    get_def_use_mgr()->AnalyzeInstDefUse(added_instr);
    context()->set_instr_block(added_instr, block);
    ++idx;
  }
  return true;
}